

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c74_mock_clock.h
# Opt level: O2

void __thiscall c74::mock::clock::unset(clock *this)

{
  pointer peVar1;
  
  std::mutex::lock(&this->scheduled_events_mutex);
  std::
  _Rb_tree<c74::mock::clock::event,_c74::mock::clock::event,_std::_Identity<c74::mock::clock::event>,_std::less<c74::mock::clock::event>,_std::allocator<c74::mock::clock::event>_>
  ::clear(&(this->scheduled_events)._M_t);
  pthread_mutex_unlock((pthread_mutex_t *)&this->scheduled_events_mutex);
  std::mutex::lock(&this->pending_events_mutex);
  peVar1 = (this->pending_events).
           super__Vector_base<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->pending_events).
      super__Vector_base<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>._M_impl.
      super__Vector_impl_data._M_finish != peVar1) {
    (this->pending_events).
    super__Vector_base<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>._M_impl.
    super__Vector_impl_data._M_finish = peVar1;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->pending_events_mutex);
  return;
}

Assistant:

void unset() {
            {
                lock l(scheduled_events_mutex);
                scheduled_events.clear();
            }
            {
                lock l(pending_events_mutex);
                pending_events.clear();
            }
        }